

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O0

bool __thiscall MeCab::FeatureIndex::openTemplate(FeatureIndex *this,Param *param)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  long *plVar5;
  FeatureIndex *in_RDI;
  char *column [4];
  scoped_fixed_array<char,_8192> buf;
  ifstream ifs;
  string filename;
  value_type *in_stack_fffffffffffffb38;
  scoped_fixed_array<char,_8192> *in_stack_fffffffffffffb40;
  scoped_fixed_array<char,_8192> *this_00;
  ostream *in_stack_fffffffffffffb60;
  ostream *in_stack_fffffffffffffb68;
  ostream *in_stack_fffffffffffffb70;
  ostream *in_stack_fffffffffffffb78;
  ostream *in_stack_fffffffffffffb80;
  char *in_stack_fffffffffffffc00;
  Param *in_stack_fffffffffffffc08;
  allocator local_359;
  string local_358 [32];
  string local_338 [32];
  scoped_fixed_array<char,_8192> local_318;
  die local_2f1;
  char *local_2f0;
  char *local_2e8;
  byte local_2da;
  die local_2d9;
  char *local_2d8;
  char *local_2d0;
  scoped_fixed_array<char,_8192> local_2b0;
  byte local_292;
  die local_291;
  long local_290 [67];
  allocator local_71;
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  Param::get<std::__cxx11::string>(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"feature.def",&local_71);
  create_filename((string *)in_stack_fffffffffffffb68,(string *)in_stack_fffffffffffffb60);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_50);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_290,pcVar3,_S_in);
  local_292 = 0;
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_290 + *(long *)(local_290[0] + -0x18)));
  if (!bVar1) {
    die::die(&local_291);
    local_292 = 1;
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x51);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"ifs");
    poVar4 = std::operator<<(poVar4,"] ");
    poVar4 = std::operator<<(poVar4,"no such file or directory: ");
    poVar4 = std::operator<<(poVar4,local_30);
    die::operator&(&local_291,poVar4);
  }
  if ((local_292 & 1) != 0) {
    die::~die((die *)0x10dce3);
  }
  scoped_fixed_array<char,_8192>::scoped_fixed_array(in_stack_fffffffffffffb40);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::clear
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x10dd06);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::clear
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x10dd1a);
  while( true ) {
    pcVar3 = scoped_fixed_array<char,_8192>::get(&local_2b0);
    scoped_fixed_array<char,_8192>::size(&local_2b0);
    plVar5 = (long *)std::istream::getline((char *)local_290,(long)pcVar3);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
    if (!bVar1) break;
    pcVar3 = scoped_fixed_array<char,_8192>::operator[](&local_2b0,0);
    if (((*pcVar3 != '\0') &&
        (pcVar3 = scoped_fixed_array<char,_8192>::operator[](&local_2b0,0), *pcVar3 != '#')) &&
       (pcVar3 = scoped_fixed_array<char,_8192>::operator[](&local_2b0,0), *pcVar3 != ' ')) {
      local_2da = 0;
      in_stack_fffffffffffffc08 = (Param *)scoped_fixed_array<char,_8192>::get(&local_2b0);
      in_stack_fffffffffffffc00 =
           (char *)tokenize2<char**>((char *)in_stack_fffffffffffffb80,
                                     (char *)in_stack_fffffffffffffb78,
                                     (char **)in_stack_fffffffffffffb70,
                                     (size_t)in_stack_fffffffffffffb68);
      if (in_stack_fffffffffffffc00 != (char *)0x2) {
        die::die(&local_2d9);
        local_2da = 1;
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                                );
        poVar4 = std::operator<<(poVar4,"(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x5d);
        poVar4 = std::operator<<(poVar4,") [");
        poVar4 = std::operator<<(poVar4,"tokenize2(buf.get(), \"\\t \", column, 2) == 2");
        poVar4 = std::operator<<(poVar4,"] ");
        poVar4 = std::operator<<(poVar4,"format error: ");
        poVar4 = std::operator<<(poVar4,local_30);
        die::operator&(&local_2d9,poVar4);
      }
      if ((local_2da & 1) != 0) {
        die::~die((die *)0x10e090);
      }
      iVar2 = strcmp(local_2d8,"UNIGRAM");
      if (iVar2 == 0) {
        local_2e8 = strdup(in_RDI,local_2d0);
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffb40,
                   in_stack_fffffffffffffb38);
      }
      else {
        iVar2 = strcmp(local_2d8,"BIGRAM");
        if (iVar2 == 0) {
          local_2f0 = strdup(in_RDI,local_2d0);
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                     in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
        }
        else {
          die::die(&local_2f1);
          poVar4 = std::operator<<((ostream *)&std::cerr,
                                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,"(");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x65);
          in_stack_fffffffffffffb80 = std::operator<<(poVar4,") [");
          in_stack_fffffffffffffb78 = std::operator<<(in_stack_fffffffffffffb80,"false");
          in_stack_fffffffffffffb70 = std::operator<<(in_stack_fffffffffffffb78,"] ");
          in_stack_fffffffffffffb68 = std::operator<<(in_stack_fffffffffffffb70,"format error: ");
          in_stack_fffffffffffffb60 = std::operator<<(in_stack_fffffffffffffb68,local_30);
          die::operator&(&local_2f1,in_stack_fffffffffffffb60);
          die::~die((die *)0x10e28f);
        }
      }
    }
  }
  Param::get<std::__cxx11::string>(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_358,"rewrite.def",&local_359);
  create_filename((string *)in_stack_fffffffffffffb68,(string *)in_stack_fffffffffffffb60);
  this_00 = &local_318;
  std::__cxx11::string::operator=(local_30,(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  std::__cxx11::string::~string(local_338);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  DictionaryRewriter::open(&in_RDI->rewrite_,pcVar3,0);
  scoped_fixed_array<char,_8192>::~scoped_fixed_array(this_00);
  std::ifstream::~ifstream(local_290);
  std::__cxx11::string::~string(local_30);
  return true;
}

Assistant:

bool FeatureIndex::openTemplate(const Param &param) {
  std::string filename = create_filename(param.get<std::string>("dicdir"),
                                         FEATURE_FILE);
  std::ifstream ifs(WPATH(filename.c_str()));
  CHECK_DIE(ifs) << "no such file or directory: " << filename;

  scoped_fixed_array<char, BUF_SIZE> buf;
  char *column[4];

  unigram_templs_.clear();
  bigram_templs_.clear();

  while (ifs.getline(buf.get(), buf.size())) {
    if (buf[0] == '\0' || buf[0] == '#' || buf[0] == ' ') {
      continue;
    }
    CHECK_DIE(tokenize2(buf.get(), "\t ", column, 2) == 2)
        << "format error: " <<filename;

    if (std::strcmp(column[0], "UNIGRAM") == 0) {
      unigram_templs_.push_back(this->strdup(column[1]));
    } else if (std::strcmp(column[0], "BIGRAM") == 0) {
      bigram_templs_.push_back(this->strdup(column[1]));
    } else {
      CHECK_DIE(false) << "format error: " <<  filename;
    }
  }

  // second, open rewrite rules
  filename = create_filename(param.get<std::string>("dicdir"),
                             REWRITE_FILE);
  rewrite_.open(filename.c_str());

  return true;
}